

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_ds.h
# Opt level: O1

void * stbds_hmdel_key(void *a,size_t elemsize,void *key,size_t keysize,size_t keyoffset,int mode)

{
  long *plVar1;
  stbds_hash_index *ot;
  stbds_hash_bucket *psVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  stbds_hash_index *psVar6;
  size_t slot_count;
  long lVar7;
  long lVar8;
  void *__dest;
  undefined8 *key_00;
  
  if (a == (void *)0x0) {
    a = (void *)0x0;
  }
  else {
    ot = *(stbds_hash_index **)((long)a + (-0x10 - elemsize));
    *(undefined8 *)((long)a + (-8 - elemsize)) = 0;
    if ((ot != (stbds_hash_index *)0x0) &&
       (uVar5 = stbds_hm_find_slot(a,elemsize,key,keysize,keyoffset,mode), -1 < (long)uVar5)) {
      uVar4 = uVar5 & 0xffffffffffffff8;
      psVar2 = ot->storage;
      lVar8 = -elemsize;
      uVar5 = (ulong)((uint)uVar5 & 7);
      lVar3 = psVar2->index[uVar4 * 2 + uVar5];
      lVar7 = *(long *)((long)a + lVar8 + -0x20) + -2;
      ot->used_count = ot->used_count - 1;
      ot->tombstone_count = ot->tombstone_count + 1;
      *(undefined8 *)((long)a + lVar8 + -8) = 1;
      psVar2->hash[uVar4 * 2 + uVar5] = 1;
      psVar2->index[uVar4 * 2 + uVar5] = -2;
      if ((mode == 1) && ((ot->string).mode == '\x02')) {
        free(*(void **)((long)a + lVar3 * elemsize));
      }
      if (lVar3 != lVar7) {
        __dest = (void *)(lVar3 * elemsize + (long)a);
        memmove(__dest,(void *)(lVar7 * elemsize + (long)a),elemsize);
        key_00 = (undefined8 *)((long)__dest + keyoffset);
        if (mode == 1) {
          key_00 = (undefined8 *)*key_00;
          mode = 1;
        }
        uVar5 = stbds_hm_find_slot(a,elemsize,key_00,keysize,keyoffset,mode);
        ot->storage->index[(uVar5 & 0xffffffffffffff8) * 2 + (ulong)((uint)uVar5 & 7)] = lVar3;
      }
      plVar1 = (long *)((long)a + lVar8 + -0x20);
      *plVar1 = *plVar1 + -1;
      if ((ot->used_count < ot->used_count_shrink_threshold) && (8 < ot->slot_count)) {
        slot_count = ot->slot_count >> 1;
      }
      else {
        if (ot->tombstone_count <= ot->tombstone_count_threshold) {
          return a;
        }
        slot_count = ot->slot_count;
      }
      psVar6 = stbds_make_hash_index(slot_count,ot);
      *(stbds_hash_index **)((long)a + lVar8 + -0x10) = psVar6;
      free(ot);
    }
  }
  return a;
}

Assistant:

void * stbds_hmdel_key(void *a, size_t elemsize, void *key, size_t keysize, size_t keyoffset, int mode)
{
  if (a == NULL) {
    return 0;
  } else {
    stbds_hash_index *table;
    void *raw_a = STBDS_HASH_TO_ARR(a,elemsize);
    table = (stbds_hash_index *) stbds_header(raw_a)->hash_table;
    stbds_temp(raw_a) = 0;
    if (table == 0) {
      return a;
    } else {
      ptrdiff_t slot;
      slot = stbds_hm_find_slot(a, elemsize, key, keysize, keyoffset, mode);
      if (slot < 0)
        return a;
      else {
        stbds_hash_bucket *b = &table->storage[slot >> STBDS_BUCKET_SHIFT];
        int i = slot & STBDS_BUCKET_MASK;
        ptrdiff_t old_index = b->index[i];
        ptrdiff_t final_index = (ptrdiff_t) stbds_arrlen(raw_a)-1-1; // minus one for the raw_a vs a, and minus one for 'last'
        STBDS_ASSERT(slot < (ptrdiff_t) table->slot_count);
        --table->used_count;
        ++table->tombstone_count;
        stbds_temp(raw_a) = 1;
        STBDS_ASSERT(table->used_count >= 0);
        //STBDS_ASSERT(table->tombstone_count < table->slot_count/4);
        b->hash[i] = STBDS_HASH_DELETED;
        b->index[i] = STBDS_INDEX_DELETED;

        if (mode == STBDS_HM_STRING && table->string.mode == STBDS_SH_STRDUP)
          STBDS_FREE(NULL, *(char**) ((char *) a+elemsize*old_index));

        // if indices are the same, memcpy is a no-op, but back-pointer-fixup will fail, so skip
        if (old_index != final_index) {
          // swap delete
          memmove((char*) a + elemsize*old_index, (char*) a + elemsize*final_index, elemsize);

          // now find the slot for the last element
          if (mode == STBDS_HM_STRING)
            slot = stbds_hm_find_slot(a, elemsize, *(char**) ((char *) a+elemsize*old_index + keyoffset), keysize, keyoffset, mode);
          else
            slot = stbds_hm_find_slot(a, elemsize,  (char* ) a+elemsize*old_index + keyoffset, keysize, keyoffset, mode);
          STBDS_ASSERT(slot >= 0);
          b = &table->storage[slot >> STBDS_BUCKET_SHIFT];
          i = slot & STBDS_BUCKET_MASK;
          STBDS_ASSERT(b->index[i] == final_index);
          b->index[i] = old_index;
        }
        stbds_header(raw_a)->length -= 1;

        if (table->used_count < table->used_count_shrink_threshold && table->slot_count > STBDS_BUCKET_LENGTH) {
          stbds_header(raw_a)->hash_table = stbds_make_hash_index(table->slot_count>>1, table);
          STBDS_FREE(NULL, table);
          STBDS_STATS(++stbds_hash_shrink);
        } else if (table->tombstone_count > table->tombstone_count_threshold) {
          stbds_header(raw_a)->hash_table = stbds_make_hash_index(table->slot_count   , table);
          STBDS_FREE(NULL, table);
          STBDS_STATS(++stbds_hash_rebuild);
        }

        return a;
      }
    }
  }
  /* NOTREACHED */
}